

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::EdgeDescriptorSyntax>
          (DeepCloneVisitor *this,EdgeDescriptorSyntax *node,BumpAllocator *alloc)

{
  EdgeDescriptorSyntax *pEVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->t1,alloc);
  local_38 = parsing::Token::deepClone(&node->t2,alloc);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EdgeDescriptorSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return &pEVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }